

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O2

void __thiscall TargetImageWidget::onSaveImageRequested(TargetImageWidget *this)

{
  undefined1 local_68 [48];
  QArrayDataPointer<char16_t> local_38;
  QString fileName;
  
  QString::QString((QString *)local_68,"Select Image");
  QString::QString((QString *)&local_38,"");
  QString::QString((QString *)(local_68 + 0x18),"Images (*.png *.xpm *.jpg)");
  QFileDialog::getSaveFileName(&fileName,this,local_68,&local_38,local_68 + 0x18,0,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_68 + 0x18));
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
  GetImageInViewTargetArea((TargetImageWidget *)local_68);
  QImage::save((QString *)local_68,(char *)&fileName,0);
  QImage::~QImage((QImage *)local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&fileName.d);
  return;
}

Assistant:

void TargetImageWidget::onSaveImageRequested()
{
    QString fileName = QFileDialog::getSaveFileName(this, "Select Image", "", "Images (*.png *.xpm *.jpg)");
    GetImageInViewTargetArea().save(fileName);
}